

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinPC07OPT_K>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double tau_a;
  double dVar12;
  double dVar13;
  double vtb;
  double vta;
  double vlb;
  double vla;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  long local_80;
  const_host_buffer_type local_78;
  const_host_buffer_type local_70;
  const_host_buffer_type local_68;
  const_host_buffer_type local_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  if (0 < N) {
    lVar5 = (ulong)(uint)N << 3;
    lVar4 = 2;
    lVar6 = 0;
    dVar8 = scal_fact;
    dVar9 = scal_fact;
    local_80 = lVar5;
    local_78 = tau;
    local_70 = lapl;
    local_68 = sigma;
    local_60 = rho;
    local_58 = scal_fact;
    dStack_50 = scal_fact;
    local_48 = scal_fact;
    do {
      dVar10 = *(double *)((long)rho + lVar6 * 2);
      dVar11 = *(double *)((long)rho + lVar6 * 2 + 8);
      dVar13 = *(double *)((long)tau + lVar6 * 2);
      dVar3 = *(double *)((long)tau + lVar6 * 2 + 8);
      local_88 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      local_a0 = 0.0;
      local_a8 = 0.0;
      local_b0 = 0.0;
      local_b8 = 0.0;
      local_c0 = 0.0;
      local_c8 = 0.0;
      local_d0 = 0.0;
      if (1e-15 < dVar10 + dVar11) {
        dVar8 = 1e-15;
        if (1e-15 <= dVar10) {
          dVar8 = dVar10;
        }
        dVar9 = 1e-15;
        if (1e-15 <= dVar11) {
          dVar9 = dVar11;
        }
        dVar10 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= sigma[lVar4 + -2]) {
          dVar10 = sigma[lVar4 + -2];
        }
        dVar11 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= sigma[lVar4]) {
          dVar11 = sigma[lVar4];
        }
        tau_a = 0.0;
        if (0.0 <= dVar13) {
          tau_a = dVar13;
        }
        dVar13 = 0.0;
        if (0.0 <= dVar3) {
          dVar13 = dVar3;
        }
        dVar12 = (dVar10 + dVar11) * 0.5;
        uVar7 = -(ulong)(-dVar12 <= sigma[lVar4 + -1]);
        dVar3 = (double)(uVar7 & (ulong)sigma[lVar4 + -1] | ~uVar7 & (ulong)-dVar12);
        uVar7 = -(ulong)(dVar3 <= dVar12);
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar_impl
                  (dVar8,dVar9,dVar10,(double)(~uVar7 & (ulong)dVar12 | uVar7 & (ulong)dVar3),dVar11
                   ,*(double *)((long)lapl + lVar6 * 2),*(double *)((long)lapl + lVar6 * 2 + 8),
                   tau_a,dVar13,&local_88,&local_90,&local_98,&local_a0,&local_a8,&local_b0,
                   &local_b8,&local_c0,&local_c8,&local_d0);
        lapl = local_70;
        sigma = local_68;
        rho = local_60;
        lVar5 = local_80;
        tau = local_78;
        scal_fact = local_48;
        dVar8 = local_58;
        dVar9 = dStack_50;
      }
      *(double *)((long)eps + lVar6) = local_88 * scal_fact + *(double *)((long)eps + lVar6);
      pdVar1 = (double *)((long)vrho + lVar6 * 2);
      dVar10 = pdVar1[1];
      pdVar2 = (double *)((long)vrho + lVar6 * 2);
      *pdVar2 = local_90 * dVar8 + *pdVar1;
      pdVar2[1] = local_98 * dVar9 + dVar10;
      dVar10 = (vsigma + lVar4 + -2)[1];
      vsigma[lVar4 + -2] = local_a0 * dVar8 + vsigma[lVar4 + -2];
      (vsigma + lVar4 + -2)[1] = local_a8 * dVar9 + dVar10;
      vsigma[lVar4] = local_b0 * scal_fact + vsigma[lVar4];
      pdVar1 = (double *)((long)vtau + lVar6 * 2);
      dVar10 = pdVar1[1];
      pdVar2 = (double *)((long)vtau + lVar6 * 2);
      *pdVar2 = local_c8 * dVar8 + *pdVar1;
      pdVar2[1] = local_d0 * dVar9 + dVar10;
      pdVar1 = (double *)((long)vlapl + lVar6 * 2);
      dVar10 = pdVar1[1];
      pdVar2 = (double *)((long)vlapl + lVar6 * 2);
      *pdVar2 = local_b8 * dVar8 + *pdVar1;
      pdVar2[1] = local_c0 * dVar9 + dVar10;
      lVar4 = lVar4 + 3;
      lVar6 = lVar6 + 8;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;

    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double e, vra, vrb, vsaa,vsab,vsbb, vla, vlb, vta, vtb;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      e, vra, vrb, vsaa, vsab, vsbb, vla, vlb, vta, vtb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;
    vtau_i[0]   += scal_fact * vta;
    vtau_i[1]   += scal_fact * vtb;
    if(traits::needs_laplacian) {
      vlapl_i[0] += scal_fact * vla;
      vlapl_i[1] += scal_fact * vlb;
    }

  }

}